

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall t_netstd_generator::generate_netstd_union(t_netstd_generator *this,t_struct *tunion)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  ostream *poVar3;
  int __oflag;
  string local_2b8;
  string local_298;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  undefined1 local_230 [8];
  ofstream_with_content_based_conditional_update f_union;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string f_union_name;
  int ic;
  t_struct *tunion_local;
  t_netstd_generator *this_local;
  
  f_union_name.field_2._12_4_ = t_generator::indent_count((t_generator *)this);
  std::operator+(&local_80,&this->namespace_dir_,"/");
  iVar1 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+(&local_60,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,".cs");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,pcVar2,&local_251);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(char *)local_250,__oflag);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  reset_indent(this);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_278);
  poVar3 = std::operator<<((ostream *)local_230,local_278);
  netstd_type_usings_abi_cxx11_(&local_298,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_298);
  netstd_thrift_usings_abi_cxx11_(&local_2b8,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string(local_278);
  poVar3 = (ostream *)local_230;
  generate_netstd_union_definition(this,poVar3,tunion);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(int)poVar3);
  t_generator::indent_validate
            ((t_generator *)this,f_union_name.field_2._12_4_,"generate_netstd_union.");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union(t_struct* tunion)
{
    int ic = indent_count();

    string f_union_name = namespace_dir_ + "/" + (tunion->get_name()) + ".cs";
    ofstream_with_content_based_conditional_update f_union;

    f_union.open(f_union_name.c_str());

    reset_indent();
    f_union << autogen_comment() << netstd_type_usings() << netstd_thrift_usings() << endl;

    generate_netstd_union_definition(f_union, tunion);

    f_union.close();

    indent_validate(ic, "generate_netstd_union.");
}